

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

int __thiscall sptk::swipe::sieve(swipe *this,intvector ones)

{
  int iVar1;
  uint uVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 *puVar12;
  double dVar13;
  
  puVar3 = ones._0_8_;
  iVar5 = (int)this;
  dVar13 = (double)iVar5;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  dVar13 = floor(dVar13);
  uVar2 = (uint)dVar13;
  *puVar3 = 0;
  iVar1 = 0;
  if (1 < (int)uVar2) {
    puVar4 = puVar3 + 3;
    iVar1 = 0;
    uVar6 = 1;
    lVar7 = 8;
    iVar8 = 3;
    iVar9 = 2;
    do {
      if (puVar3[uVar6] == 1) {
        puVar12 = puVar4;
        iVar11 = iVar8;
        iVar10 = (int)uVar6 * 2 + 1;
        while (iVar10 < iVar5) {
          *puVar12 = 0;
          puVar12 = (undefined4 *)((long)puVar12 + lVar7);
          iVar11 = iVar11 + iVar9;
          iVar10 = iVar11;
        }
        iVar1 = iVar1 + 1;
      }
      uVar6 = uVar6 + 1;
      puVar4 = puVar4 + 2;
      lVar7 = lVar7 + 4;
      iVar8 = iVar8 + 2;
      iVar9 = iVar9 + 1;
    } while (uVar6 != uVar2);
  }
  if ((int)uVar2 < iVar5) {
    lVar7 = (long)(int)uVar2;
    do {
      iVar1 = iVar1 + (uint)(puVar3[lVar7] == 1);
      lVar7 = lVar7 + 1;
    } while (iVar5 != lVar7);
  }
  return iVar1;
}

Assistant:

int sieve(intvector ones) {
    int k = 0;
    int sp = floor(sqrt(ones.x));
    int i, j;
    ones.v[0] = NP; // 1 is not prime, though sometimes I wish it was
    for (i = 1; i < sp; i++) {
        if PRIME(ones.v[i]) {
            for (j = i + i + 1; j < ones.x; j += i + 1)
                ones.v[j] = NP;
            k++;
        }
    }
    for (i = sp; i < ones.x; i++) { // now we're only counting
        if PRIME(ones.v[i])
            k++;
    }
    return(k);
}